

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fps_compression.cpp
# Opt level: O3

void compress_vertices(char *filename)

{
  uint nr_of_vertices_00;
  int val;
  ostream *poVar1;
  size_t __size;
  ulong uVar2;
  uint32_t nr_of_vertices;
  uint32_t nr_of_floats;
  uint32_t nr_of_compressed_z_bytes;
  uint32_t nr_of_compressed_y_bytes;
  uint32_t nr_of_compressed_x_bytes;
  float *z;
  float *y;
  float *decompressed_z;
  float *decompressed_y;
  float *decompressed_x;
  float *x;
  uint8_t *compressed_z;
  uint8_t *compressed_y;
  uint8_t *compressed_x;
  uint32_t *triangles;
  float *vertices;
  uint32_t nr_of_triangles;
  uint local_a4;
  uint local_a0;
  uint local_9c;
  uint local_98;
  uint local_94;
  float *local_90;
  float *local_88;
  float *local_80;
  float *local_78;
  float *local_70;
  float *local_68;
  uint8_t *local_60;
  uint8_t *local_58;
  uint8_t *local_50;
  uint32_t *local_48;
  float *local_40;
  uint32_t local_34;
  
  val = trico_read_stl(&local_a4,&local_40,&local_34,&local_48,filename);
  TestEq<int,int>(1,val,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico.tests/fps_compression.cpp"
                  ,0xac,"void compress_vertices(const char *)");
  nr_of_vertices_00 = local_a4;
  __size = (ulong)local_a4 << 2;
  local_68 = (float *)malloc(__size);
  local_88 = (float *)malloc(__size);
  local_90 = (float *)malloc(__size);
  trico_transpose_xyz_aos_to_soa(&local_68,&local_88,&local_90,local_40,nr_of_vertices_00);
  trico_compress(&local_94,&local_50,local_68,local_a4,4,10);
  trico_decompress(&local_a0,&local_70,local_50);
  TestEq<unsigned_int,unsigned_int>
            (local_a4,local_a0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico.tests/fps_compression.cpp"
             ,0xbc,"void compress_vertices(const char *)");
  if (local_a0 != 0) {
    uVar2 = 0;
    do {
      TestEq<float,float>(local_68[uVar2],local_70[uVar2],
                          "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico.tests/fps_compression.cpp"
                          ,0xbf,"void compress_vertices(const char *)");
      uVar2 = uVar2 + 1;
    } while (uVar2 < local_a0);
  }
  trico_compress(&local_98,&local_58,local_88,local_a4,4,10);
  trico_decompress(&local_a0,&local_78,local_58);
  TestEq<unsigned_int,unsigned_int>
            (local_a4,local_a0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico.tests/fps_compression.cpp"
             ,200,"void compress_vertices(const char *)");
  if (local_a0 != 0) {
    uVar2 = 0;
    do {
      TestEq<float,float>(local_88[uVar2],local_78[uVar2],
                          "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico.tests/fps_compression.cpp"
                          ,0xcb,"void compress_vertices(const char *)");
      uVar2 = uVar2 + 1;
    } while (uVar2 < local_a0);
  }
  trico_compress(&local_9c,&local_60,local_90,local_a4,4,10);
  trico_decompress(&local_a0,&local_80,local_60);
  TestEq<unsigned_int,unsigned_int>
            (local_a4,local_a0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico.tests/fps_compression.cpp"
             ,0xd4,"void compress_vertices(const char *)");
  if (local_a0 != 0) {
    uVar2 = 0;
    do {
      TestEq<float,float>(local_90[uVar2],local_80[uVar2],
                          "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico.tests/fps_compression.cpp"
                          ,0xd7,"void compress_vertices(const char *)");
      uVar2 = uVar2 + 1;
    } while (uVar2 < local_a0);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Compression ratio for x: ",0x19);
  poVar1 = std::ostream::_M_insert<double>((double)(((float)local_a4 * 4.0) / (float)local_94));
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Compression ratio for y: ",0x19);
  poVar1 = std::ostream::_M_insert<double>((double)(((float)local_a4 * 4.0) / (float)local_98));
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Compression ratio for z: ",0x19);
  poVar1 = std::ostream::_M_insert<double>((double)(((float)local_a4 * 4.0) / (float)local_9c));
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Total compression ratio: ",0x19);
  poVar1 = std::ostream::_M_insert<double>
                     ((double)(((float)local_a4 * 12.0) / (float)(local_98 + local_94 + local_9c)));
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  free(local_70);
  free(local_50);
  free(local_78);
  free(local_58);
  free(local_80);
  free(local_60);
  free(local_68);
  free(local_88);
  free(local_90);
  free(local_40);
  free(local_48);
  return;
}

Assistant:

void compress_vertices(const char* filename)
  {

  uint32_t nr_of_vertices;
  float* vertices;
  uint32_t nr_of_triangles;
  uint32_t* triangles;

  TEST_EQ(1, trico_read_stl(&nr_of_vertices, &vertices, &nr_of_triangles, &triangles, filename));

  float* x = (float*)trico_malloc(sizeof(float)*nr_of_vertices);
  float* y = (float*)trico_malloc(sizeof(float)*nr_of_vertices);
  float* z = (float*)trico_malloc(sizeof(float)*nr_of_vertices);

  trico_transpose_xyz_aos_to_soa(&x, &y, &z, vertices, nr_of_vertices);

  uint32_t nr_of_compressed_x_bytes;
  uint8_t* compressed_x;
  trico_compress(&nr_of_compressed_x_bytes, &compressed_x, x, nr_of_vertices, 4, 10);

  uint32_t nr_of_floats;
  float* decompressed_x;
  trico_decompress(&nr_of_floats, &decompressed_x, compressed_x);

  TEST_EQ(nr_of_vertices, nr_of_floats);

  for (uint32_t i = 0; i < nr_of_floats; ++i)
    TEST_EQ(x[i], decompressed_x[i]);

  uint32_t nr_of_compressed_y_bytes;
  uint8_t* compressed_y;
  trico_compress(&nr_of_compressed_y_bytes, &compressed_y, y, nr_of_vertices, 4, 10);

  float* decompressed_y;
  trico_decompress(&nr_of_floats, &decompressed_y, compressed_y);

  TEST_EQ(nr_of_vertices, nr_of_floats);

  for (uint32_t i = 0; i < nr_of_floats; ++i)
    TEST_EQ(y[i], decompressed_y[i]);

  uint32_t nr_of_compressed_z_bytes;
  uint8_t* compressed_z;
  trico_compress(&nr_of_compressed_z_bytes, &compressed_z, z, nr_of_vertices, 4, 10);

  float* decompressed_z;
  trico_decompress(&nr_of_floats, &decompressed_z, compressed_z);

  TEST_EQ(nr_of_vertices, nr_of_floats);

  for (uint32_t i = 0; i < nr_of_floats; ++i)
    TEST_EQ(z[i], decompressed_z[i]);


  std::cout << "Compression ratio for x: " << ((float)nr_of_vertices*4.f) / (float)nr_of_compressed_x_bytes << "\n";
  std::cout << "Compression ratio for y: " << ((float)nr_of_vertices*4.f) / (float)nr_of_compressed_y_bytes << "\n";
  std::cout << "Compression ratio for z: " << ((float)nr_of_vertices*4.f) / (float)nr_of_compressed_z_bytes << "\n";
  std::cout << "Total compression ratio: " << ((float)nr_of_vertices*12.f) / (float)(nr_of_compressed_x_bytes + nr_of_compressed_y_bytes + nr_of_compressed_z_bytes) << "\n";

  trico_free(decompressed_x);
  trico_free(compressed_x);
  trico_free(decompressed_y);
  trico_free(compressed_y);
  trico_free(decompressed_z);
  trico_free(compressed_z);
  trico_free(x);
  trico_free(y);
  trico_free(z);
  trico_free(vertices);
  trico_free(triangles);
  }